

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

int __thiscall
fmt::v10::basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>::get_id<char>
          (basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *this,
          basic_string_view<char> name)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  size_t __n;
  int *piVar5;
  long lVar6;
  bool bVar7;
  
  uVar4 = name.size_;
  if ((this->desc_ >> 0x3e & 1) != 0) {
    uVar3 = (ulong)(-1 < (long)this->desc_) << 4 | 0xffffffffffffffe0;
    lVar6 = *(long *)((long)&((this->field_1).values_)->field_0 + uVar3 + 8);
    if (lVar6 != 0) {
      piVar5 = (int *)(*(long *)((long)&((this->field_1).values_)->field_0 + uVar3) + 8);
      do {
        __s = *(char **)(piVar5 + -2);
        sVar2 = strlen(__s);
        __n = sVar2;
        if (uVar4 <= sVar2) {
          __n = uVar4;
        }
        if (__n == 0) {
          bVar7 = true;
        }
        else {
          iVar1 = bcmp(__s,name.data_,__n);
          bVar7 = iVar1 == 0;
        }
        if ((sVar2 == uVar4) && (bVar7)) {
          return *piVar5;
        }
        piVar5 = piVar5 + 4;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
  }
  return -1;
}

Assistant:

auto get_id(basic_string_view<Char> name) const -> int {
    if (!has_named_args()) return -1;
    const auto& named_args =
        (is_packed() ? values_[-1] : args_[-1].value_).named_args;
    for (size_t i = 0; i < named_args.size; ++i) {
      if (named_args.data[i].name == name) return named_args.data[i].id;
    }
    return -1;
  }